

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreateInlineListFileSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar1;
  PositionType PVar2;
  PositionType it;
  cmState *pcVar3;
  ReferenceType __src;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  iterator iVar7;
  iterator local_170;
  Snapshot *local_160;
  long local_158;
  string *local_150;
  string *local_148;
  cmState *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  it = originSnapshot.Position;
  local_160 = __return_storage_ptr__;
  local_158 = entryPointLine;
  local_150 = entryPointCommand;
  local_148 = fileName;
  local_140 = this;
  __src = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  memcpy((SnapshotDataType *)local_118,__src,0xa8);
  pcVar1 = (__src->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (__src->EntryPointCommand)._M_string_length);
  local_50 = __src->EntryPointLine;
  sStack_48 = __src->IncludeDirectoryPosition;
  local_40 = __src->CompileDefinitionsPosition;
  sStack_38 = __src->CompileOptionsPosition;
  local_170 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar4->EntryPointLine = local_158;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  std::__cxx11::string::_M_assign((string *)&pSVar4->EntryPointCommand);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar4->SnapshotType = InlineListFileType;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pcVar3 = local_140;
  pSVar4->Keep = true;
  this_00 = &local_140->ExecutionListFiles;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar7 = pSVar4->ExecutionListFile;
  pcVar1 = (local_148->_M_dataplus)._M_p;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + local_148->_M_string_length);
  iVar7 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(this_00,iVar7,&local_138);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar4->ExecutionListFile = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  (pBVar5->DirectoryEnd).Tree = local_170.Tree;
  (pBVar5->DirectoryEnd).Position = local_170.Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  PVar2 = (pSVar4->Policies).Position;
  (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
  (pSVar6->PolicyScope).Position = PVar2;
  local_160->State = pcVar3;
  (local_160->Position).Tree = local_170.Tree;
  (local_160->Position).Position = local_170.Position;
  return local_160;
}

Assistant:

cmState::Snapshot
cmState::CreateInlineListFileSnapshot(cmState::Snapshot originSnapshot,
                                      const std::string& entryPointCommand,
                                      long entryPointLine,
                                      const std::string& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = InlineListFileType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}